

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

bool __thiscall QHostInfoLookupManager::wasAborted(QHostInfoLookupManager *this,int id)

{
  long lVar1;
  QMutex *pQVar2;
  int *piVar3;
  __pointer_type pQVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  pQVar2 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar7 = (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar7) {
      (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar7) goto LAB_001af6b5;
  }
  QBasicMutex::lockInternal();
LAB_001af6b5:
  bVar7 = true;
  if (this->wasDeleted == false) {
    lVar5 = (this->abortedLookups).d.size;
    if (lVar5 == 0) {
LAB_001af6f5:
      bVar7 = false;
    }
    else {
      lVar6 = 0;
      do {
        if (lVar5 << 2 == lVar6) goto LAB_001af6f5;
        lVar1 = lVar6 + 4;
        piVar3 = (int *)((long)(this->abortedLookups).d.ptr + lVar6);
        lVar6 = lVar1;
      } while (*piVar3 != id);
      bVar7 = lVar1 != 0;
    }
  }
  LOCK();
  pQVar4 = (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar4 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar2);
  }
  return bVar7;
}

Assistant:

bool QHostInfoLookupManager::wasAborted(int id)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return true;

    return abortedLookups.contains(id);
}